

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

int luaZ_fill(ZIO *z)

{
  uint uVar1;
  size_t in_RAX;
  byte *pbVar2;
  size_t size;
  
  size = in_RAX;
  pbVar2 = (byte *)(*z->reader)(z->L,z->data,&size);
  if (size == 0 || pbVar2 == (byte *)0x0) {
    uVar1 = 0xffffffff;
  }
  else {
    z->n = size - 1;
    z->p = (char *)(pbVar2 + 1);
    uVar1 = (uint)*pbVar2;
  }
  return uVar1;
}

Assistant:

static int luaZ_fill(ZIO*z){
size_t size;
lua_State*L=z->L;
const char*buff;
buff=z->reader(L,z->data,&size);
if(buff==NULL||size==0)return(-1);
z->n=size-1;
z->p=buff;
return char2int(*(z->p++));
}